

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureBufferParamValueIntToFloatConversion.cpp
# Opt level: O3

void __thiscall
glcts::TextureBufferParamValueIntToFloatConversion::initTest
          (TextureBufferParamValueIntToFloatConversion *this)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  bool bVar24;
  int iVar25;
  deUint32 dVar26;
  GLuint GVar27;
  undefined4 extraout_var;
  void *pvVar29;
  NotSupportedError *this_00;
  TestError *this_01;
  char cVar30;
  ulong uVar31;
  char *this_02;
  uint uVar32;
  long lVar33;
  uint uVar34;
  float fVar35;
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  int iVar46;
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  long lVar45;
  undefined1 auVar47 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 in_XMM11 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  int iVar67;
  undefined1 auVar65 [16];
  int iVar68;
  undefined1 auVar66 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  int iVar82;
  int iVar86;
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  GLint max_workgroup_size;
  string csSource;
  char *csCode;
  int local_6c;
  string local_68;
  undefined1 local_48 [16];
  pointer local_30;
  long lVar28;
  long lVar48;
  
  if ((this->super_TestCaseBase).m_is_texture_buffer_supported == false) {
    this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (this_00,"Texture buffer functionality not supported, skipping",
               fixed_sample_locations_values + 1,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferParamValueIntToFloatConversion.cpp"
               ,0x4a);
    __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  }
  iVar25 = (*((this->super_TestCaseBase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar28 = CONCAT44(extraout_var,iVar25);
  (**(code **)(lVar28 + 0x860))(0x91bf,0,&local_6c);
  dVar26 = (**(code **)(lVar28 + 0x800))();
  glu::checkError(dVar26,"Error getting GL_MAX_COMPUTE_WORK_GROUP_SIZE parameter value!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferParamValueIntToFloatConversion.cpp"
                  ,0x52);
  fVar35 = (float)local_6c;
  if (fVar35 < 0.0) {
    fVar35 = sqrtf(fVar35);
  }
  else {
    fVar35 = SQRT(fVar35);
  }
  fVar35 = floorf(fVar35);
  uVar34 = (uint)(long)fVar35;
  m_work_group_x_size = 0x10;
  if (uVar34 < 0x10) {
    m_work_group_x_size = uVar34;
  }
  uVar32 = m_work_group_x_size * m_work_group_x_size;
  m_texture_buffer_size = uVar32;
  m_work_group_y_size = m_work_group_x_size;
  pvVar29 = operator_new__((ulong)uVar32);
  auVar23 = _DAT_019ec5b0;
  if (uVar34 != 0) {
    lVar33 = (ulong)uVar32 - 1;
    local_48._8_4_ = (int)lVar33;
    local_48._0_8_ = lVar33;
    local_48._12_4_ = (int)((ulong)lVar33 >> 0x20);
    uVar31 = 0;
    auVar36 = local_48;
    auVar47 = _DAT_01a9aba0;
    auVar49 = _DAT_01a9abb0;
    auVar50 = _DAT_01a9abc0;
    auVar51 = _DAT_01a9abd0;
    auVar52 = _DAT_01a918f0;
    auVar53 = _DAT_01a91900;
    auVar54 = _DAT_01a1c6c0;
    auVar55 = _DAT_019f34d0;
    do {
      auVar65 = local_48 ^ auVar23;
      auVar69 = auVar55 ^ auVar23;
      iVar25 = auVar65._0_4_;
      iVar82 = -(uint)(iVar25 < auVar69._0_4_);
      iVar46 = auVar65._4_4_;
      auVar71._4_4_ = -(uint)(iVar46 < auVar69._4_4_);
      iVar67 = auVar65._8_4_;
      iVar86 = -(uint)(iVar67 < auVar69._8_4_);
      iVar68 = auVar65._12_4_;
      auVar71._12_4_ = -(uint)(iVar68 < auVar69._12_4_);
      auVar65._4_4_ = iVar82;
      auVar65._0_4_ = iVar82;
      auVar65._8_4_ = iVar86;
      auVar65._12_4_ = iVar86;
      auVar65 = pshuflw(auVar36,auVar65,0xe8);
      auVar70._4_4_ = -(uint)(auVar69._4_4_ == iVar46);
      auVar70._12_4_ = -(uint)(auVar69._12_4_ == iVar68);
      auVar70._0_4_ = auVar70._4_4_;
      auVar70._8_4_ = auVar70._12_4_;
      auVar56 = pshuflw(in_XMM11,auVar70,0xe8);
      auVar71._0_4_ = auVar71._4_4_;
      auVar71._8_4_ = auVar71._12_4_;
      auVar69 = pshuflw(auVar65,auVar71,0xe8);
      auVar36._8_4_ = 0xffffffff;
      auVar36._0_8_ = 0xffffffffffffffff;
      auVar36._12_4_ = 0xffffffff;
      auVar36 = (auVar69 | auVar56 & auVar65) ^ auVar36;
      auVar36 = packssdw(auVar36,auVar36);
      cVar30 = (char)uVar31;
      if ((auVar36 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        *(char *)((long)pvVar29 + uVar31) = cVar30;
      }
      auVar56._4_4_ = iVar82;
      auVar56._0_4_ = iVar82;
      auVar56._8_4_ = iVar86;
      auVar56._12_4_ = iVar86;
      auVar71 = auVar70 & auVar56 | auVar71;
      auVar36 = packssdw(auVar71,auVar71);
      auVar69._8_4_ = 0xffffffff;
      auVar69._0_8_ = 0xffffffffffffffff;
      auVar69._12_4_ = 0xffffffff;
      auVar36 = packssdw(auVar36 ^ auVar69,auVar36 ^ auVar69);
      auVar36 = packsswb(auVar36,auVar36);
      if ((auVar36._0_4_ >> 8 & 1) != 0) {
        *(char *)((long)pvVar29 + uVar31 + 1) = cVar30 + '\x01';
      }
      auVar36 = auVar54 ^ auVar23;
      auVar57._0_4_ = -(uint)(iVar25 < auVar36._0_4_);
      auVar57._4_4_ = -(uint)(iVar46 < auVar36._4_4_);
      auVar57._8_4_ = -(uint)(iVar67 < auVar36._8_4_);
      auVar57._12_4_ = -(uint)(iVar68 < auVar36._12_4_);
      auVar72._4_4_ = auVar57._0_4_;
      auVar72._0_4_ = auVar57._0_4_;
      auVar72._8_4_ = auVar57._8_4_;
      auVar72._12_4_ = auVar57._8_4_;
      iVar82 = -(uint)(auVar36._4_4_ == iVar46);
      iVar86 = -(uint)(auVar36._12_4_ == iVar68);
      auVar10._4_4_ = iVar82;
      auVar10._0_4_ = iVar82;
      auVar10._8_4_ = iVar86;
      auVar10._12_4_ = iVar86;
      auVar83._4_4_ = auVar57._4_4_;
      auVar83._0_4_ = auVar57._4_4_;
      auVar83._8_4_ = auVar57._12_4_;
      auVar83._12_4_ = auVar57._12_4_;
      auVar36 = auVar10 & auVar72 | auVar83;
      auVar36 = packssdw(auVar36,auVar36);
      auVar1._8_4_ = 0xffffffff;
      auVar1._0_8_ = 0xffffffffffffffff;
      auVar1._12_4_ = 0xffffffff;
      auVar36 = packssdw(auVar36 ^ auVar1,auVar36 ^ auVar1);
      auVar36 = packsswb(auVar36,auVar36);
      if ((auVar36._0_4_ >> 0x10 & 1) != 0) {
        *(char *)((long)pvVar29 + uVar31 + 2) = cVar30 + '\x02';
      }
      auVar36 = pshufhw(auVar36,auVar72,0x84);
      auVar11._4_4_ = iVar82;
      auVar11._0_4_ = iVar82;
      auVar11._8_4_ = iVar86;
      auVar11._12_4_ = iVar86;
      auVar69 = pshufhw(auVar57,auVar11,0x84);
      auVar65 = pshufhw(auVar36,auVar83,0x84);
      auVar37._8_4_ = 0xffffffff;
      auVar37._0_8_ = 0xffffffffffffffff;
      auVar37._12_4_ = 0xffffffff;
      auVar37 = (auVar65 | auVar69 & auVar36) ^ auVar37;
      auVar36 = packssdw(auVar37,auVar37);
      auVar36 = packsswb(auVar36,auVar36);
      if ((auVar36._0_4_ >> 0x18 & 1) != 0) {
        *(char *)((long)pvVar29 + uVar31 + 3) = cVar30 + '\x03';
      }
      auVar36 = auVar53 ^ auVar23;
      auVar58._0_4_ = -(uint)(iVar25 < auVar36._0_4_);
      auVar58._4_4_ = -(uint)(iVar46 < auVar36._4_4_);
      auVar58._8_4_ = -(uint)(iVar67 < auVar36._8_4_);
      auVar58._12_4_ = -(uint)(iVar68 < auVar36._12_4_);
      auVar12._4_4_ = auVar58._0_4_;
      auVar12._0_4_ = auVar58._0_4_;
      auVar12._8_4_ = auVar58._8_4_;
      auVar12._12_4_ = auVar58._8_4_;
      auVar69 = pshuflw(auVar83,auVar12,0xe8);
      auVar38._0_4_ = -(uint)(auVar36._0_4_ == iVar25);
      auVar38._4_4_ = -(uint)(auVar36._4_4_ == iVar46);
      auVar38._8_4_ = -(uint)(auVar36._8_4_ == iVar67);
      auVar38._12_4_ = -(uint)(auVar36._12_4_ == iVar68);
      auVar73._4_4_ = auVar38._4_4_;
      auVar73._0_4_ = auVar38._4_4_;
      auVar73._8_4_ = auVar38._12_4_;
      auVar73._12_4_ = auVar38._12_4_;
      auVar36 = pshuflw(auVar38,auVar73,0xe8);
      auVar74._4_4_ = auVar58._4_4_;
      auVar74._0_4_ = auVar58._4_4_;
      auVar74._8_4_ = auVar58._12_4_;
      auVar74._12_4_ = auVar58._12_4_;
      auVar65 = pshuflw(auVar58,auVar74,0xe8);
      auVar2._8_4_ = 0xffffffff;
      auVar2._0_8_ = 0xffffffffffffffff;
      auVar2._12_4_ = 0xffffffff;
      auVar36 = packssdw(auVar36 & auVar69,(auVar65 | auVar36 & auVar69) ^ auVar2);
      auVar36 = packsswb(auVar36,auVar36);
      if ((auVar36 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
        *(char *)((long)pvVar29 + uVar31 + 4) = cVar30 + '\x04';
      }
      auVar13._4_4_ = auVar58._0_4_;
      auVar13._0_4_ = auVar58._0_4_;
      auVar13._8_4_ = auVar58._8_4_;
      auVar13._12_4_ = auVar58._8_4_;
      auVar74 = auVar73 & auVar13 | auVar74;
      auVar65 = packssdw(auVar74,auVar74);
      auVar3._8_4_ = 0xffffffff;
      auVar3._0_8_ = 0xffffffffffffffff;
      auVar3._12_4_ = 0xffffffff;
      auVar36 = packssdw(auVar36,auVar65 ^ auVar3);
      auVar36 = packsswb(auVar36,auVar36);
      if ((auVar36._4_2_ >> 8 & 1) != 0) {
        *(char *)((long)pvVar29 + uVar31 + 5) = cVar30 + '\x05';
      }
      auVar36 = auVar52 ^ auVar23;
      auVar59._0_4_ = -(uint)(iVar25 < auVar36._0_4_);
      auVar59._4_4_ = -(uint)(iVar46 < auVar36._4_4_);
      auVar59._8_4_ = -(uint)(iVar67 < auVar36._8_4_);
      auVar59._12_4_ = -(uint)(iVar68 < auVar36._12_4_);
      auVar75._4_4_ = auVar59._0_4_;
      auVar75._0_4_ = auVar59._0_4_;
      auVar75._8_4_ = auVar59._8_4_;
      auVar75._12_4_ = auVar59._8_4_;
      iVar82 = -(uint)(auVar36._4_4_ == iVar46);
      iVar86 = -(uint)(auVar36._12_4_ == iVar68);
      auVar14._4_4_ = iVar82;
      auVar14._0_4_ = iVar82;
      auVar14._8_4_ = iVar86;
      auVar14._12_4_ = iVar86;
      auVar84._4_4_ = auVar59._4_4_;
      auVar84._0_4_ = auVar59._4_4_;
      auVar84._8_4_ = auVar59._12_4_;
      auVar84._12_4_ = auVar59._12_4_;
      auVar36 = auVar14 & auVar75 | auVar84;
      auVar36 = packssdw(auVar36,auVar36);
      auVar4._8_4_ = 0xffffffff;
      auVar4._0_8_ = 0xffffffffffffffff;
      auVar4._12_4_ = 0xffffffff;
      auVar36 = packssdw(auVar36 ^ auVar4,auVar36 ^ auVar4);
      auVar36 = packsswb(auVar36,auVar36);
      if ((auVar36 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
        *(char *)((long)pvVar29 + uVar31 + 6) = cVar30 + '\x06';
      }
      auVar36 = pshufhw(auVar36,auVar75,0x84);
      auVar15._4_4_ = iVar82;
      auVar15._0_4_ = iVar82;
      auVar15._8_4_ = iVar86;
      auVar15._12_4_ = iVar86;
      auVar69 = pshufhw(auVar59,auVar15,0x84);
      auVar65 = pshufhw(auVar36,auVar84,0x84);
      auVar39._8_4_ = 0xffffffff;
      auVar39._0_8_ = 0xffffffffffffffff;
      auVar39._12_4_ = 0xffffffff;
      auVar39 = (auVar65 | auVar69 & auVar36) ^ auVar39;
      auVar36 = packssdw(auVar39,auVar39);
      auVar36 = packsswb(auVar36,auVar36);
      if ((auVar36._6_2_ >> 8 & 1) != 0) {
        *(char *)((long)pvVar29 + uVar31 + 7) = cVar30 + '\a';
      }
      auVar36 = auVar51 ^ auVar23;
      auVar60._0_4_ = -(uint)(iVar25 < auVar36._0_4_);
      auVar60._4_4_ = -(uint)(iVar46 < auVar36._4_4_);
      auVar60._8_4_ = -(uint)(iVar67 < auVar36._8_4_);
      auVar60._12_4_ = -(uint)(iVar68 < auVar36._12_4_);
      auVar16._4_4_ = auVar60._0_4_;
      auVar16._0_4_ = auVar60._0_4_;
      auVar16._8_4_ = auVar60._8_4_;
      auVar16._12_4_ = auVar60._8_4_;
      auVar69 = pshuflw(auVar84,auVar16,0xe8);
      auVar40._0_4_ = -(uint)(auVar36._0_4_ == iVar25);
      auVar40._4_4_ = -(uint)(auVar36._4_4_ == iVar46);
      auVar40._8_4_ = -(uint)(auVar36._8_4_ == iVar67);
      auVar40._12_4_ = -(uint)(auVar36._12_4_ == iVar68);
      auVar76._4_4_ = auVar40._4_4_;
      auVar76._0_4_ = auVar40._4_4_;
      auVar76._8_4_ = auVar40._12_4_;
      auVar76._12_4_ = auVar40._12_4_;
      auVar36 = pshuflw(auVar40,auVar76,0xe8);
      auVar77._4_4_ = auVar60._4_4_;
      auVar77._0_4_ = auVar60._4_4_;
      auVar77._8_4_ = auVar60._12_4_;
      auVar77._12_4_ = auVar60._12_4_;
      auVar65 = pshuflw(auVar60,auVar77,0xe8);
      auVar61._8_4_ = 0xffffffff;
      auVar61._0_8_ = 0xffffffffffffffff;
      auVar61._12_4_ = 0xffffffff;
      auVar61 = (auVar65 | auVar36 & auVar69) ^ auVar61;
      auVar65 = packssdw(auVar61,auVar61);
      auVar36 = packsswb(auVar36 & auVar69,auVar65);
      if ((auVar36 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        *(char *)((long)pvVar29 + uVar31 + 8) = cVar30 + '\b';
      }
      auVar17._4_4_ = auVar60._0_4_;
      auVar17._0_4_ = auVar60._0_4_;
      auVar17._8_4_ = auVar60._8_4_;
      auVar17._12_4_ = auVar60._8_4_;
      auVar77 = auVar76 & auVar17 | auVar77;
      auVar65 = packssdw(auVar77,auVar77);
      auVar5._8_4_ = 0xffffffff;
      auVar5._0_8_ = 0xffffffffffffffff;
      auVar5._12_4_ = 0xffffffff;
      auVar65 = packssdw(auVar65 ^ auVar5,auVar65 ^ auVar5);
      auVar36 = packsswb(auVar36,auVar65);
      if ((auVar36._8_2_ >> 8 & 1) != 0) {
        *(char *)((long)pvVar29 + uVar31 + 9) = cVar30 + '\t';
      }
      auVar36 = auVar50 ^ auVar23;
      auVar62._0_4_ = -(uint)(iVar25 < auVar36._0_4_);
      auVar62._4_4_ = -(uint)(iVar46 < auVar36._4_4_);
      auVar62._8_4_ = -(uint)(iVar67 < auVar36._8_4_);
      auVar62._12_4_ = -(uint)(iVar68 < auVar36._12_4_);
      auVar78._4_4_ = auVar62._0_4_;
      auVar78._0_4_ = auVar62._0_4_;
      auVar78._8_4_ = auVar62._8_4_;
      auVar78._12_4_ = auVar62._8_4_;
      iVar82 = -(uint)(auVar36._4_4_ == iVar46);
      iVar86 = -(uint)(auVar36._12_4_ == iVar68);
      auVar18._4_4_ = iVar82;
      auVar18._0_4_ = iVar82;
      auVar18._8_4_ = iVar86;
      auVar18._12_4_ = iVar86;
      auVar85._4_4_ = auVar62._4_4_;
      auVar85._0_4_ = auVar62._4_4_;
      auVar85._8_4_ = auVar62._12_4_;
      auVar85._12_4_ = auVar62._12_4_;
      auVar36 = auVar18 & auVar78 | auVar85;
      auVar36 = packssdw(auVar36,auVar36);
      auVar6._8_4_ = 0xffffffff;
      auVar6._0_8_ = 0xffffffffffffffff;
      auVar6._12_4_ = 0xffffffff;
      auVar36 = packssdw(auVar36 ^ auVar6,auVar36 ^ auVar6);
      auVar36 = packsswb(auVar36,auVar36);
      if ((auVar36 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
        *(char *)((long)pvVar29 + uVar31 + 10) = cVar30 + '\n';
      }
      auVar36 = pshufhw(auVar36,auVar78,0x84);
      auVar19._4_4_ = iVar82;
      auVar19._0_4_ = iVar82;
      auVar19._8_4_ = iVar86;
      auVar19._12_4_ = iVar86;
      auVar69 = pshufhw(auVar62,auVar19,0x84);
      auVar65 = pshufhw(auVar36,auVar85,0x84);
      auVar41._8_4_ = 0xffffffff;
      auVar41._0_8_ = 0xffffffffffffffff;
      auVar41._12_4_ = 0xffffffff;
      auVar41 = (auVar65 | auVar69 & auVar36) ^ auVar41;
      auVar36 = packssdw(auVar41,auVar41);
      auVar36 = packsswb(auVar36,auVar36);
      if ((auVar36._10_2_ >> 8 & 1) != 0) {
        *(char *)((long)pvVar29 + uVar31 + 0xb) = cVar30 + '\v';
      }
      auVar36 = auVar49 ^ auVar23;
      auVar63._0_4_ = -(uint)(iVar25 < auVar36._0_4_);
      auVar63._4_4_ = -(uint)(iVar46 < auVar36._4_4_);
      auVar63._8_4_ = -(uint)(iVar67 < auVar36._8_4_);
      auVar63._12_4_ = -(uint)(iVar68 < auVar36._12_4_);
      auVar20._4_4_ = auVar63._0_4_;
      auVar20._0_4_ = auVar63._0_4_;
      auVar20._8_4_ = auVar63._8_4_;
      auVar20._12_4_ = auVar63._8_4_;
      auVar69 = pshuflw(auVar85,auVar20,0xe8);
      auVar42._0_4_ = -(uint)(auVar36._0_4_ == iVar25);
      auVar42._4_4_ = -(uint)(auVar36._4_4_ == iVar46);
      auVar42._8_4_ = -(uint)(auVar36._8_4_ == iVar67);
      auVar42._12_4_ = -(uint)(auVar36._12_4_ == iVar68);
      auVar79._4_4_ = auVar42._4_4_;
      auVar79._0_4_ = auVar42._4_4_;
      auVar79._8_4_ = auVar42._12_4_;
      auVar79._12_4_ = auVar42._12_4_;
      auVar36 = pshuflw(auVar42,auVar79,0xe8);
      auVar80._4_4_ = auVar63._4_4_;
      auVar80._0_4_ = auVar63._4_4_;
      auVar80._8_4_ = auVar63._12_4_;
      auVar80._12_4_ = auVar63._12_4_;
      auVar65 = pshuflw(auVar63,auVar80,0xe8);
      auVar7._8_4_ = 0xffffffff;
      auVar7._0_8_ = 0xffffffffffffffff;
      auVar7._12_4_ = 0xffffffff;
      auVar36 = packssdw(auVar36 & auVar69,(auVar65 | auVar36 & auVar69) ^ auVar7);
      auVar36 = packsswb(auVar36,auVar36);
      if ((auVar36 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
        *(char *)((long)pvVar29 + uVar31 + 0xc) = cVar30 + '\f';
      }
      auVar21._4_4_ = auVar63._0_4_;
      auVar21._0_4_ = auVar63._0_4_;
      auVar21._8_4_ = auVar63._8_4_;
      auVar21._12_4_ = auVar63._8_4_;
      auVar80 = auVar79 & auVar21 | auVar80;
      auVar65 = packssdw(auVar80,auVar80);
      auVar8._8_4_ = 0xffffffff;
      auVar8._0_8_ = 0xffffffffffffffff;
      auVar8._12_4_ = 0xffffffff;
      auVar36 = packssdw(auVar36,auVar65 ^ auVar8);
      auVar36 = packsswb(auVar36,auVar36);
      if ((auVar36._12_2_ >> 8 & 1) != 0) {
        *(char *)((long)pvVar29 + uVar31 + 0xd) = cVar30 + '\r';
      }
      auVar36 = auVar47 ^ auVar23;
      auVar64._0_4_ = -(uint)(iVar25 < auVar36._0_4_);
      auVar64._4_4_ = -(uint)(iVar46 < auVar36._4_4_);
      auVar64._8_4_ = -(uint)(iVar67 < auVar36._8_4_);
      auVar64._12_4_ = -(uint)(iVar68 < auVar36._12_4_);
      auVar81._4_4_ = auVar64._0_4_;
      auVar81._0_4_ = auVar64._0_4_;
      auVar81._8_4_ = auVar64._8_4_;
      auVar81._12_4_ = auVar64._8_4_;
      iVar25 = -(uint)(auVar36._4_4_ == iVar46);
      iVar46 = -(uint)(auVar36._12_4_ == iVar68);
      auVar66._4_4_ = iVar25;
      auVar66._0_4_ = iVar25;
      auVar66._8_4_ = iVar46;
      auVar66._12_4_ = iVar46;
      auVar43._4_4_ = auVar64._4_4_;
      auVar43._0_4_ = auVar64._4_4_;
      auVar43._8_4_ = auVar64._12_4_;
      auVar43._12_4_ = auVar64._12_4_;
      auVar43 = auVar66 & auVar81 | auVar43;
      auVar36 = packssdw(auVar43,auVar43);
      auVar9._8_4_ = 0xffffffff;
      auVar9._0_8_ = 0xffffffffffffffff;
      auVar9._12_4_ = 0xffffffff;
      auVar36 = packssdw(auVar36 ^ auVar9,auVar36 ^ auVar9);
      auVar36 = packsswb(auVar36,auVar36);
      if ((auVar36 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
        *(char *)((long)pvVar29 + uVar31 + 0xe) = cVar30 + '\x0e';
      }
      auVar36 = pshufhw(auVar36,auVar81,0x84);
      in_XMM11 = pshufhw(auVar64,auVar66,0x84);
      in_XMM11 = in_XMM11 & auVar36;
      auVar22._4_4_ = auVar64._4_4_;
      auVar22._0_4_ = auVar64._4_4_;
      auVar22._8_4_ = auVar64._12_4_;
      auVar22._12_4_ = auVar64._12_4_;
      auVar36 = pshufhw(auVar36,auVar22,0x84);
      auVar44._8_4_ = 0xffffffff;
      auVar44._0_8_ = 0xffffffffffffffff;
      auVar44._12_4_ = 0xffffffff;
      auVar44 = (auVar36 | in_XMM11) ^ auVar44;
      auVar36 = packssdw(auVar44,auVar44);
      auVar36 = packsswb(auVar36,auVar36);
      if ((auVar36._14_2_ >> 8 & 1) != 0) {
        *(char *)((long)pvVar29 + uVar31 + 0xf) = cVar30 + '\x0f';
      }
      uVar31 = uVar31 + 0x10;
      lVar33 = (long)DAT_01a9abe0;
      lVar48 = auVar55._8_8_;
      auVar55._0_8_ = auVar55._0_8_ + lVar33;
      lVar45 = DAT_01a9abe0._8_8_;
      auVar55._8_8_ = lVar48 + lVar45;
      lVar48 = auVar54._8_8_;
      auVar54._0_8_ = auVar54._0_8_ + lVar33;
      auVar54._8_8_ = lVar48 + lVar45;
      lVar48 = auVar53._8_8_;
      auVar53._0_8_ = auVar53._0_8_ + lVar33;
      auVar53._8_8_ = lVar48 + lVar45;
      lVar48 = auVar52._8_8_;
      auVar52._0_8_ = auVar52._0_8_ + lVar33;
      auVar52._8_8_ = lVar48 + lVar45;
      lVar48 = auVar51._8_8_;
      auVar51._0_8_ = auVar51._0_8_ + lVar33;
      auVar51._8_8_ = lVar48 + lVar45;
      lVar48 = auVar50._8_8_;
      auVar50._0_8_ = auVar50._0_8_ + lVar33;
      auVar50._8_8_ = lVar48 + lVar45;
      lVar48 = auVar49._8_8_;
      auVar49._0_8_ = auVar49._0_8_ + lVar33;
      auVar49._8_8_ = lVar48 + lVar45;
      lVar48 = auVar47._8_8_;
      auVar47._0_8_ = auVar47._0_8_ + lVar33;
      auVar47._8_8_ = lVar48 + lVar45;
      auVar36 = _DAT_01a9abe0;
    } while ((uVar32 + 0xf & 0x7f0) != uVar31);
  }
  (**(code **)(lVar28 + 0x6c8))(1,&this->m_tbo_id);
  dVar26 = (**(code **)(lVar28 + 0x800))();
  glu::checkError(dVar26,"Error generating buffer object!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferParamValueIntToFloatConversion.cpp"
                  ,0x60);
  (**(code **)(lVar28 + 0x40))
            ((this->super_TestCaseBase).m_glExtTokens.TEXTURE_BUFFER,this->m_tbo_id);
  dVar26 = (**(code **)(lVar28 + 0x800))();
  glu::checkError(dVar26,"Error binding buffer object!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferParamValueIntToFloatConversion.cpp"
                  ,0x62);
  (**(code **)(lVar28 + 0x150))
            ((this->super_TestCaseBase).m_glExtTokens.TEXTURE_BUFFER,m_texture_buffer_size,pvVar29,
             0x88e5);
  dVar26 = (**(code **)(lVar28 + 0x800))();
  glu::checkError(dVar26,"Error allocating buffer object\'s data store!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferParamValueIntToFloatConversion.cpp"
                  ,0x65);
  operator_delete__(pvVar29);
  (**(code **)(lVar28 + 0x6f8))(1,&this->m_tbo_tex_id);
  dVar26 = (**(code **)(lVar28 + 0x800))();
  glu::checkError(dVar26,"Error generating texture object!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferParamValueIntToFloatConversion.cpp"
                  ,0x6b);
  (**(code **)(lVar28 + 8))(0x84c0);
  dVar26 = (**(code **)(lVar28 + 0x800))();
  glu::checkError(dVar26,"Error setting active texture unit!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferParamValueIntToFloatConversion.cpp"
                  ,0x6d);
  (**(code **)(lVar28 + 0xb8))
            ((this->super_TestCaseBase).m_glExtTokens.TEXTURE_BUFFER,this->m_tbo_tex_id);
  dVar26 = (**(code **)(lVar28 + 0x800))();
  glu::checkError(dVar26,"Error binding texture object to GL_TEXTURE_BUFFER_EXT target!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferParamValueIntToFloatConversion.cpp"
                  ,0x6f);
  (**(code **)(lVar28 + 0x12f8))
            ((this->super_TestCaseBase).m_glExtTokens.TEXTURE_BUFFER,0x8229,this->m_tbo_id);
  dVar26 = (**(code **)(lVar28 + 0x800))();
  glu::checkError(dVar26,"Error setting buffer object as texture buffer\'s data store!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferParamValueIntToFloatConversion.cpp"
                  ,0x72);
  GVar27 = (**(code **)(lVar28 + 0x3c8))();
  this->m_po_id = GVar27;
  dVar26 = (**(code **)(lVar28 + 0x800))();
  glu::checkError(dVar26,"Error creating program object!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferParamValueIntToFloatConversion.cpp"
                  ,0x76);
  GVar27 = (**(code **)(lVar28 + 0x3f0))(0x91b9);
  this->m_cs_id = GVar27;
  dVar26 = (**(code **)(lVar28 + 0x800))();
  this_02 = "Error creating shader object!";
  glu::checkError(dVar26,"Error creating shader object!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferParamValueIntToFloatConversion.cpp"
                  ,0x79);
  getComputeShaderCode_abi_cxx11_(&local_68,(TextureBufferParamValueIntToFloatConversion *)this_02);
  local_30 = local_68._M_dataplus._M_p;
  bVar24 = TestCaseBase::buildProgram
                     (&this->super_TestCaseBase,this->m_po_id,this->m_cs_id,1,&local_30,(bool *)0x0)
  ;
  if (bVar24) {
    (**(code **)(lVar28 + 0x6c8))(1,&this->m_ssbo_id);
    dVar26 = (**(code **)(lVar28 + 0x800))();
    glu::checkError(dVar26,"Error generating buffer object!",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferParamValueIntToFloatConversion.cpp"
                    ,0x85);
    (**(code **)(lVar28 + 0x40))(0x8892,this->m_ssbo_id);
    dVar26 = (**(code **)(lVar28 + 0x800))();
    glu::checkError(dVar26,"Error binding  buffer object!",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferParamValueIntToFloatConversion.cpp"
                    ,0x87);
    (**(code **)(lVar28 + 0x150))(0x8892,(ulong)m_texture_buffer_size << 2,0,0x88ea);
    dVar26 = (**(code **)(lVar28 + 0x800))();
    glu::checkError(dVar26,"Error generating buffer object!",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferParamValueIntToFloatConversion.cpp"
                    ,0x89);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
    }
    return;
  }
  this_01 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this_01,"Could not create a program object from valid compute shader object!",
             (char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferParamValueIntToFloatConversion.cpp"
             ,0x80);
  __cxa_throw(this_01,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void TextureBufferParamValueIntToFloatConversion::initTest(void)
{
	/* Check if texture buffer extension is supported */
	if (!m_is_texture_buffer_supported)
	{
		throw tcu::NotSupportedError(TEXTURE_BUFFER_EXTENSION_NOT_SUPPORTED, "", __FILE__, __LINE__);
	}

	/* Get GL entry points */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	glw::GLint max_workgroup_size;
	gl.getIntegeri_v(GL_MAX_COMPUTE_WORK_GROUP_SIZE, 0, &max_workgroup_size);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error getting GL_MAX_COMPUTE_WORK_GROUP_SIZE parameter value!");

	m_work_group_x_size = m_work_group_y_size = de::min((glw::GLuint)floor(sqrt((float)max_workgroup_size)), 16u);
	m_texture_buffer_size					  = m_work_group_x_size * m_work_group_y_size;

	glw::GLubyte* dataBuffer = new glw::GLubyte[m_texture_buffer_size];

	for (glw::GLuint i = 0; i < m_texture_buffer_size; ++i)
	{
		dataBuffer[i] = (glw::GLubyte)i;
	}

	/* Create texture buffer object*/
	gl.genBuffers(1, &m_tbo_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error generating buffer object!");
	gl.bindBuffer(m_glExtTokens.TEXTURE_BUFFER, m_tbo_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error binding buffer object!");
	gl.bufferData(m_glExtTokens.TEXTURE_BUFFER, m_texture_buffer_size * sizeof(glw::GLubyte), &dataBuffer[0],
				  GL_STATIC_READ);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error allocating buffer object's data store!");

	delete[] dataBuffer;

	/* Initialize texture buffer */
	gl.genTextures(1, &m_tbo_tex_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error generating texture object!");
	gl.activeTexture(GL_TEXTURE0);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error setting active texture unit!");
	gl.bindTexture(m_glExtTokens.TEXTURE_BUFFER, m_tbo_tex_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error binding texture object to GL_TEXTURE_BUFFER_EXT target!");

	gl.texBuffer(m_glExtTokens.TEXTURE_BUFFER, GL_R8, m_tbo_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error setting buffer object as texture buffer's data store!");

	/* Create program */
	m_po_id = gl.createProgram();
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error creating program object!");

	m_cs_id = gl.createShader(GL_COMPUTE_SHADER);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error creating shader object!");

	std::string csSource = getComputeShaderCode();
	const char* csCode   = csSource.c_str();

	if (!buildProgram(m_po_id, m_cs_id, 1, &csCode))
	{
		TCU_FAIL("Could not create a program object from valid compute shader object!");
	}

	/* Create Shader Storage Buffer Object */
	gl.genBuffers(1, &m_ssbo_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error generating buffer object!");
	gl.bindBuffer(GL_ARRAY_BUFFER, m_ssbo_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error binding  buffer object!");
	gl.bufferData(GL_ARRAY_BUFFER, m_texture_buffer_size * sizeof(glw::GLfloat), 0, GL_DYNAMIC_COPY);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error generating buffer object!");
}